

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall duckdb::MD5Context::MD5Context(MD5Context *this)

{
  this->buf[0] = 0x67452301;
  this->buf[1] = 0xefcdab89;
  this->buf[2] = 0x98badcfe;
  this->buf[3] = 0x10325476;
  this->bits[0] = 0;
  this->bits[1] = 0;
  return;
}

Assistant:

MD5Context::MD5Context() {
	buf[0] = 0x67452301;
	buf[1] = 0xefcdab89;
	buf[2] = 0x98badcfe;
	buf[3] = 0x10325476;
	bits[0] = 0;
	bits[1] = 0;
}